

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseProtoMapField(Parser *this,StructDef *struct_def)

{
  size_type *psVar1;
  Value *this_00;
  string *in_RDX;
  CheckedError *ce;
  int t;
  allocator<char> local_129;
  undefined1 local_128 [32];
  FieldDef *field;
  FieldDef *key_field;
  StructDef *entry_table;
  string local_f0;
  string proto_field_id;
  string field_name;
  FieldDef *value_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> entry_table_name;
  FieldDef *local_68;
  undefined2 uStack_60;
  undefined6 uStack_5e;
  undefined2 uStack_58;
  undefined8 uStack_56;
  FieldDef *local_48;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined8 uStack_36;
  
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    t = (int)struct_def;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      uStack_38 = 0;
      uStack_36 = 0;
      local_48 = (FieldDef *)0x0;
      uStack_40 = 0;
      uStack_3e = 0;
      ParseType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          uStack_58 = 0;
          uStack_56 = 0;
          local_68 = (FieldDef *)0x0;
          uStack_60 = 0;
          uStack_5e = 0;
          ParseType(this,(Type *)struct_def);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              psVar1 = &(struct_def->super_Definition).file._M_string_length;
              std::__cxx11::string::string((string *)&field_name,(string *)psVar1);
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckedError::~CheckedError((CheckedError *)this);
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckedError::~CheckedError((CheckedError *)this);
                  std::__cxx11::string::string((string *)&proto_field_id,(string *)psVar1);
                  Expect(this,t);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    CheckedError::~CheckedError((CheckedError *)this);
                    Expect(this,t);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                      CheckedError::~CheckedError((CheckedError *)this);
                      ConvertCase((string *)local_128,&field_name,kUpperCamel,kSnake);
                      std::operator+(&entry_table_name,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_128,"Entry");
                      std::__cxx11::string::~string((string *)local_128);
                      StartStruct(this,(string *)struct_def,(StructDef **)&entry_table_name);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        CheckedError::~CheckedError((CheckedError *)this);
                        entry_table->has_key = true;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_128,"key",(allocator<char> *)&local_f0);
                        AddField(this,struct_def,(string *)entry_table,(Type *)local_128,&local_48);
                        std::__cxx11::string::~string((string *)local_128);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          CheckedError::~CheckedError((CheckedError *)this);
                          key_field->key = true;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_128,"value",(allocator<char> *)&local_f0);
                          AddField(this,struct_def,(string *)entry_table,(Type *)local_128,&local_68
                                  );
                          std::__cxx11::string::~string((string *)local_128);
                          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                            CheckedError::~CheckedError((CheckedError *)this);
                            local_128._24_2_ = 0;
                            local_128._16_8_ = 0;
                            local_128._0_8_ = (pointer)0xf0000000e;
                            local_128._8_8_ = entry_table;
                            AddField(this,struct_def,in_RDX,(Type *)&field_name,
                                     (FieldDef **)local_128);
                            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                              CheckedError::~CheckedError((CheckedError *)this);
                              if (proto_field_id._M_string_length != 0) {
                                this_00 = (Value *)operator_new(0x48);
                                Value::Value(this_00);
                                std::__cxx11::string::_M_assign((string *)&this_00->constant);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_f0,"id",&local_129);
                                SymbolTable<flatbuffers::Value>::Add
                                          (&(field->super_Definition).attributes,&local_f0,this_00);
                                std::__cxx11::string::~string((string *)&local_f0);
                              }
                              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                            }
                          }
                        }
                      }
                      std::__cxx11::string::~string((string *)&entry_table_name);
                    }
                  }
                  std::__cxx11::string::~string((string *)&proto_field_id);
                }
              }
              std::__cxx11::string::~string((string *)&field_name);
            }
          }
        }
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoMapField(StructDef *struct_def) {
  NEXT();
  EXPECT('<');
  Type key_type;
  ECHECK(ParseType(key_type));
  EXPECT(',');
  Type value_type;
  ECHECK(ParseType(value_type));
  EXPECT('>');
  auto field_name = attribute_;
  NEXT();
  EXPECT('=');
  std::string proto_field_id = attribute_;
  EXPECT(kTokenIntegerConstant);
  EXPECT(';');

  auto entry_table_name = ConvertCase(field_name, Case::kUpperCamel) + "Entry";
  StructDef *entry_table;
  ECHECK(StartStruct(entry_table_name, &entry_table));
  entry_table->has_key = true;
  FieldDef *key_field;
  ECHECK(AddField(*entry_table, "key", key_type, &key_field));
  key_field->key = true;
  FieldDef *value_field;
  ECHECK(AddField(*entry_table, "value", value_type, &value_field));

  Type field_type;
  field_type.base_type = BASE_TYPE_VECTOR;
  field_type.element = BASE_TYPE_STRUCT;
  field_type.struct_def = entry_table;
  FieldDef *field;
  ECHECK(AddField(*struct_def, field_name, field_type, &field));
  if (!proto_field_id.empty()) {
    auto val = new Value();
    val->constant = proto_field_id;
    field->attributes.Add("id", val);
  }

  return NoError();
}